

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

lu_byte luaO_codeparam(uint p)

{
  lu_byte lVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  lVar1 = 0xff;
  if (p < 0x60e00) {
    uVar4 = p << 7 | 0x60;
    if (0x63f < uVar4) {
      cVar2 = '\0';
      uVar4 = uVar4 / 100;
      cVar3 = '\0';
      uVar5 = uVar4;
      if (199 < p) {
        uVar7 = (ulong)uVar4;
        do {
          cVar2 = cVar2 + '\b';
          uVar5 = (uint)(uVar7 >> 8);
          uVar6 = (uint)uVar7;
          uVar7 = uVar7 >> 8;
          cVar3 = cVar2;
        } while (0xffff < uVar6);
      }
      return (cVar3 + ""[uVar5]) * '\x10' - 0x40 |
             (char)(uVar4 >> ((cVar3 + ""[uVar5]) - 5 & 0x1f)) - 0x10U;
    }
    lVar1 = (lu_byte)(uVar4 / 100);
  }
  return lVar1;
}

Assistant:

lu_byte luaO_codeparam (unsigned int p) {
  if (p >= (cast(lu_mem, 0x1F) << (0xF - 7 - 1)) * 100u)  /* overflow? */
    return 0xFF;  /* return maximum value */
  else {
    p = (cast(l_uint32, p) * 128 + 99) / 100;  /* round up the division */
    if (p < 0x10) {  /* subnormal number? */
      /* exponent bits are already zero; nothing else to do */
      return cast_byte(p);
    }
    else {  /* p >= 0x10 implies ceil(log2(p + 1)) >= 5 */
      /* preserve 5 bits in 'p' */
      unsigned log = luaO_ceillog2(p + 1) - 5u;
      return cast_byte(((p >> log) - 0x10) | ((log + 1) << 4));
    }
  }
}